

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int get_one_and_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  
  iVar2 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    bVar1 = 0xff;
    uVar3 = 0;
    bVar5 = 0;
    for (uVar4 = input_len - 1; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
      bVar6 = input[uVar4] != '\0' | bVar5;
      uVar7 = 0;
      if (bVar6 != bVar5) {
        uVar7 = uVar4;
      }
      uVar3 = uVar3 | uVar7;
      *data_len = uVar3;
      bVar1 = bVar1 & (bVar6 == bVar5 | input[uVar4]) + 0x80;
      bVar5 = bVar6;
    }
    iVar2 = -0x6200;
    if (bVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int get_one_and_zeros_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done, bad;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    bad = 0xFF;
    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i-1] != 0 );
        *data_len |= ( i - 1 ) * ( done != prev_done );
        bad &= ( input[i-1] ^ 0x80 ) | ( done == prev_done );
    }

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );

}